

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O0

typed_value<std::vector<int,_std::allocator<int>_>,_char> * __thiscall
VW::config::options_boost_po::get_base_boost_value<int>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>_> *opt)

{
  bool bVar1;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *ptVar2;
  typed_option<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *unaff_retaddr;
  shared_ptr<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>_> *in_stack_00000008;
  options_boost_po *in_stack_00000010;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *value;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  typed_value<std::vector<int,_std::allocator<int>_>,_char> *in_stack_ffffffffffffffe0;
  
  boost::program_options::value<std::vector<int,std::allocator<int>>>();
  std::
  __shared_ptr_access<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x35dcbc);
  bVar1 = typed_option<std::vector<int,_std::allocator<int>_>_>::default_value_supplied
                    ((typed_option<std::vector<int,_std::allocator<int>_>_> *)0x35dcc4);
  if (bVar1) {
    std::
    __shared_ptr_access<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<VW::config::typed_option<std::vector<int,_std::allocator<int>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x35dcdd);
    typed_option<std::vector<int,_std::allocator<int>_>_>::default_value(in_RDI);
    boost::program_options::typed_value<std::vector<int,_std::allocator<int>_>,_char>::default_value
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffffc0);
  }
  ptVar2 = add_notifier<int>(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  ptVar2 = boost::program_options::typed_value<std::vector<int,_std::allocator<int>_>,_char>::
           composing(ptVar2);
  return ptVar2;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::get_base_boost_value(
    std::shared_ptr<typed_option<std::vector<T>>>& opt)
{
  auto value = po::value<std::vector<T>>();

  if (opt->default_value_supplied())
  {
    value->default_value(opt->default_value());
  }

  return add_notifier(opt, value)->composing();
}